

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O1

CURLcode telnet_done(connectdata *conn,CURLcode status,_Bool premature)

{
  void *pvVar1;
  
  pvVar1 = (conn->data->req).protop;
  if (pvVar1 != (void *)0x0) {
    curl_slist_free_all(*(curl_slist **)((long)pvVar1 + 0x1cb0));
    *(undefined8 *)((long)pvVar1 + 0x1cb0) = 0;
    (*Curl_cfree)((conn->data->req).protop);
    (conn->data->req).protop = (void *)0x0;
  }
  return CURLE_OK;
}

Assistant:

static CURLcode telnet_done(struct connectdata *conn,
                                 CURLcode status, bool premature)
{
  struct TELNET *tn = (struct TELNET *)conn->data->req.protop;
  (void)status; /* unused */
  (void)premature; /* not used */

  if(!tn)
    return CURLE_OK;

  curl_slist_free_all(tn->telnet_vars);
  tn->telnet_vars = NULL;

  Curl_safefree(conn->data->req.protop);

  return CURLE_OK;
}